

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRr.c
# Opt level: O2

Vec_Str_t * Abc_NtkRRSimulate(Abc_Ntk_t *pNtk)

{
  size_t __n;
  void **ppvVar1;
  int *piVar2;
  size_t sVar3;
  byte bVar4;
  int iVar5;
  uint uVar6;
  Vec_Str_t *vTargets;
  char *__s;
  Abc_Obj_t *pAVar7;
  anon_union_8_4_617c9805_for_Abc_Obj_t__17 aVar8;
  Vec_Ptr_t *vNodes;
  Vec_Ptr_t *p;
  Vec_Ptr_t *p_00;
  long *plVar9;
  void *pvVar10;
  void *pvVar11;
  anon_union_8_4_617c9805_for_Abc_Obj_t__17 aVar12;
  ulong uVar13;
  int iVar14;
  int iVar15;
  ulong uVar16;
  
  uVar16 = (ulong)pNtk->vObjs->nSize;
  __n = uVar16 + 1;
  vTargets = (Vec_Str_t *)malloc(0x10);
  sVar3 = 0x10;
  if (0xe < uVar16) {
    sVar3 = __n;
  }
  iVar15 = (int)sVar3;
  vTargets->nCap = iVar15;
  iVar14 = 0;
  if (iVar15 == 0) {
    __s = (char *)0x0;
  }
  else {
    __s = (char *)malloc((long)iVar15);
  }
  vTargets->pArray = __s;
  vTargets->nSize = (int)__n;
  memset(__s,0,__n);
  for (; iVar14 < (int)uVar16; iVar14 = iVar14 + 1) {
    pAVar7 = Abc_NtkObj(pNtk,iVar14);
    if ((pAVar7 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar7->field_0x14 & 0xf) == 7)) {
      ppvVar1 = pAVar7->pNtk->vObjs->pArray;
      piVar2 = (pAVar7->vFanins).pArray;
      Vec_StrWriteEntry(vTargets,pAVar7->Id,
                        1 < *(int *)((long)ppvVar1[*piVar2] + 0x2c) |
                        (1 < *(int *)((long)ppvVar1[piVar2[1]] + 0x2c)) * '\x02');
    }
    uVar16 = (ulong)(uint)pNtk->vObjs->nSize;
  }
  pAVar7 = Abc_AigConst1(pNtk);
  pAVar7->field_6 = (anon_union_8_4_617c9805_for_Abc_Obj_t__17)0xffffffff;
  for (iVar15 = 0; iVar15 < pNtk->vCis->nSize; iVar15 = iVar15 + 1) {
    pAVar7 = Abc_NtkCi(pNtk,iVar15);
    iVar14 = rand();
    iVar5 = rand();
    uVar6 = rand();
    aVar8._0_4_ = uVar6 ^ iVar5 << 0xc ^ iVar14 << 0x18;
    aVar8._4_4_ = 0;
    pAVar7->field_6 = aVar8;
  }
  for (iVar15 = 0; iVar15 < pNtk->vObjs->nSize; iVar15 = iVar15 + 1) {
    pAVar7 = Abc_NtkObj(pNtk,iVar15);
    if ((pAVar7 != (Abc_Obj_t *)0x0) &&
       (uVar6 = *(uint *)&pAVar7->field_0x14, iVar15 != 0 && (uVar6 & 0xf) == 7)) {
      piVar2 = (pAVar7->vFanins).pArray;
      ppvVar1 = pAVar7->pNtk->vObjs->pArray;
      aVar12._0_4_ = ((int)(uVar6 << 0x14) >> 0x1f ^ *(uint *)((long)ppvVar1[piVar2[1]] + 0x38)) &
                     ((int)(uVar6 << 0x15) >> 0x1f ^ *(uint *)((long)ppvVar1[*piVar2] + 0x38));
      aVar12._4_4_ = 0;
      pAVar7->field_6 = aVar12;
    }
  }
  for (iVar15 = 0; iVar15 < pNtk->vCos->nSize; iVar15 = iVar15 + 1) {
    pAVar7 = Abc_NtkCo(pNtk,iVar15);
    pvVar11 = (void *)(ulong)*(uint *)((long)pAVar7->pNtk->vObjs->pArray[*(pAVar7->vFanins).pArray]
                                      + 0x38);
    pvVar10 = (void *)((ulong)pvVar11 ^ 0xffffffff);
    if ((*(uint *)&pAVar7->field_0x14 >> 10 & 1) == 0) {
      pvVar10 = pvVar11;
    }
    (pAVar7->field_5).pData = pvVar10;
  }
  iVar15 = 0;
  do {
    if (pNtk->vCis->nSize <= iVar15) {
      for (iVar15 = 0; iVar15 < pNtk->vObjs->nSize; iVar15 = iVar15 + 1) {
        pAVar7 = Abc_NtkObj(pNtk,iVar15);
        if (pAVar7 != (Abc_Obj_t *)0x0) {
          (pAVar7->field_5).pData = (void *)0x0;
        }
      }
      return vTargets;
    }
    vNodes = Vec_PtrAlloc(10);
    Abc_NtkIncrementTravId(pNtk);
    for (; iVar15 < pNtk->vCis->nSize; iVar15 = iVar15 + 1) {
      pAVar7 = Abc_NtkCi(pNtk,iVar15);
      Sim_TraverseNodes_rec(pAVar7,vTargets,vNodes);
      if (0x80 < vNodes->nSize) break;
    }
    p = Vec_PtrAlloc(10);
    Abc_NtkIncrementTravId(pNtk);
    for (iVar14 = 0; iVar14 < pNtk->vCos->nSize; iVar14 = iVar14 + 1) {
      pAVar7 = Abc_NtkCo(pNtk,iVar14);
      Sim_CollectNodes_rec(pAVar7,p);
    }
    iVar14 = p->nSize;
    uVar6 = vNodes->nSize;
    uVar13 = 0;
    p_00 = Sim_UtilInfoAlloc(iVar14,uVar6,0);
    uVar16 = (ulong)uVar6;
    if ((int)uVar6 < 1) {
      uVar16 = uVar13;
    }
    if (iVar14 < 1) {
      iVar14 = 0;
    }
    while (iVar5 = (int)uVar13, iVar5 != iVar14) {
      plVar9 = (long *)Vec_PtrEntry(p,iVar5);
      uVar6 = *(uint *)((long)plVar9 + 0x14) & 0xf;
      if ((uVar6 == 5) || (uVar6 == 2)) {
        pvVar10 = Vec_PtrEntry(p_00,iVar5);
        for (uVar13 = 0; uVar16 != uVar13; uVar13 = uVar13 + 1) {
          *(int *)((long)pvVar10 + uVar13 * 4) = (int)plVar9[8];
        }
      }
      else if (0xfffffffd < uVar6 - 5) {
        pvVar10 = Vec_PtrEntry(p_00,iVar5);
        pvVar11 = Vec_PtrEntry(p_00,*(int *)(*(long *)(*(long *)(*(long *)(*plVar9 + 0x20) + 8) +
                                                      (long)*(int *)plVar9[4] * 8) + 0x38));
        if ((*(byte *)((long)plVar9 + 0x15) & 4) == 0) {
          for (uVar13 = 0; uVar16 != uVar13; uVar13 = uVar13 + 1) {
            *(undefined4 *)((long)pvVar10 + uVar13 * 4) =
                 *(undefined4 *)((long)pvVar11 + uVar13 * 4);
          }
        }
        else {
          for (uVar13 = 0; uVar16 != uVar13; uVar13 = uVar13 + 1) {
            *(uint *)((long)pvVar10 + uVar13 * 4) = ~*(uint *)((long)pvVar11 + uVar13 * 4);
          }
        }
        for (uVar13 = 0; uVar16 != uVar13; uVar13 = uVar13 + 1) {
          if (*(int *)((long)pvVar10 + uVar13 * 4) != (int)plVar9[7]) {
            pvVar11 = Vec_PtrEntry(vNodes,(int)uVar13);
            bVar4 = Vec_StrEntry(vTargets,*(int *)(((ulong)pvVar11 & 0xfffffffffffffffe) + 0x10));
            Vec_StrWriteEntry(vTargets,*(int *)(((ulong)pvVar11 & 0xfffffffffffffffe) + 0x10),
                              ((byte)pvVar11 & 1) + 1 & bVar4);
          }
        }
      }
      uVar13 = (ulong)(iVar5 + 1);
    }
    Vec_PtrFree(vNodes);
  } while( true );
}

Assistant:

Vec_Str_t * Abc_NtkRRSimulate( Abc_Ntk_t * pNtk )
{
    Vec_Ptr_t * vNodes, * vField;
    Vec_Str_t * vTargets;
    Abc_Obj_t * pObj;
    unsigned uData, uData0, uData1;
    int PrevCi, Phase, i, k;

    // start the candidates
    vTargets = Vec_StrStart( Abc_NtkObjNumMax(pNtk) + 1 );
    Abc_NtkForEachNode( pNtk, pObj, i )
    {
        Phase = ((Abc_ObjFanoutNum(Abc_ObjFanin1(pObj)) > 1) << 1);
        Phase |= (Abc_ObjFanoutNum(Abc_ObjFanin0(pObj)) > 1);
        Vec_StrWriteEntry( vTargets, pObj->Id, (char)Phase );
    }

    // simulate patters and store them in copy
    Abc_AigConst1(pNtk)->pCopy = (Abc_Obj_t *)~((unsigned)0);
    Abc_NtkForEachCi( pNtk, pObj, i )
        pObj->pCopy = (Abc_Obj_t *)(ABC_PTRUINT_T)SIM_RANDOM_UNSIGNED;
    Abc_NtkForEachNode( pNtk, pObj, i )
    {
        if ( i == 0 ) continue;
        uData0 = (unsigned)(ABC_PTRUINT_T)Abc_ObjFanin0(pObj)->pData;
        uData1 = (unsigned)(ABC_PTRUINT_T)Abc_ObjFanin1(pObj)->pData;
        uData  = Abc_ObjFaninC0(pObj)? ~uData0 : uData0;
        uData &= Abc_ObjFaninC1(pObj)? ~uData1 : uData1;
        pObj->pCopy = (Abc_Obj_t *)(ABC_PTRUINT_T)uData;
    }
    // store the result in data
    Abc_NtkForEachCo( pNtk, pObj, i )
    {
        uData0 = (unsigned)(ABC_PTRUINT_T)Abc_ObjFanin0(pObj)->pData;
        if ( Abc_ObjFaninC0(pObj) )
            pObj->pData = (void *)(ABC_PTRUINT_T)~uData0;
        else
            pObj->pData = (void *)(ABC_PTRUINT_T)uData0;
    }

    // refine the candidates
    for ( PrevCi = 0; PrevCi < Abc_NtkCiNum(pNtk); PrevCi = i )
    {
        vNodes = Vec_PtrAlloc( 10 );
        Abc_NtkIncrementTravId( pNtk );
        for ( i = PrevCi; i < Abc_NtkCiNum(pNtk); i++ )
        {
            Sim_TraverseNodes_rec( Abc_NtkCi(pNtk, i), vTargets, vNodes );
            if ( Vec_PtrSize(vNodes) > 128 )
                break;
        }
        // collect the marked nodes in the topological order
        vField = Vec_PtrAlloc( 10 );
        Abc_NtkIncrementTravId( pNtk );
        Abc_NtkForEachCo( pNtk, pObj, k )
            Sim_CollectNodes_rec( pObj, vField );

        // simulate these nodes
        Sim_SimulateCollected( vTargets, vNodes, vField );
        // prepare for the next loop
        Vec_PtrFree( vNodes );
    }

    // clean
    Abc_NtkForEachObj( pNtk, pObj, i )
        pObj->pData = NULL;
    return vTargets;
}